

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O0

int buffer_seek(buffer_t *buffer,void *data,zip_uint64_t len,zip_error_t *error)

{
  zip_uint64_t zVar1;
  zip_int64_t new_offset;
  zip_error_t *error_local;
  zip_uint64_t len_local;
  void *data_local;
  buffer_t *buffer_local;
  
  zVar1 = zip_source_seek_compute_offset(buffer->offset,buffer->size,data,len,error);
  if ((long)zVar1 < 0) {
    buffer_local._4_4_ = -1;
  }
  else {
    buffer->offset = zVar1;
    zVar1 = buffer_find_fragment(buffer,buffer->offset);
    buffer->current_fragment = zVar1;
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

static int
buffer_seek(buffer_t *buffer, void *data, zip_uint64_t len, zip_error_t *error) {
    zip_int64_t new_offset = zip_source_seek_compute_offset(buffer->offset, buffer->size, data, len, error);

    if (new_offset < 0) {
	return -1;
    }

    buffer->offset = (zip_uint64_t)new_offset;
    buffer->current_fragment = buffer_find_fragment(buffer, buffer->offset);
    return 0;
}